

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O1

fft_object fft_init(int N,int sgn)

{
  int *arr;
  int iVar1;
  int tx;
  fft_object pfVar2;
  long lVar3;
  int *piVar4;
  uint M;
  double dVar5;
  
  iVar1 = dividebyN(N);
  M = N;
  if (iVar1 == 0) {
    dVar5 = log10((double)N);
    dVar5 = ceil(dVar5 / 0.3010299956639812);
    dVar5 = exp2(dVar5);
    M = (int)dVar5 << ((int)dVar5 < N * 2 + -2);
  }
  pfVar2 = (fft_object)malloc((long)(int)M * 0x10 + 0x110);
  arr = pfVar2->factors;
  piVar4 = arr;
  tx = factors(M,arr);
  pfVar2->lf = tx;
  longvectorN(pfVar2->twiddle,(int)piVar4,arr,tx);
  pfVar2->lt = (uint)(iVar1 == 0);
  pfVar2->N = N;
  pfVar2->sgn = sgn;
  if ((sgn == -1) && (0 < (int)M)) {
    lVar3 = 0;
    do {
      *(ulong *)((long)&pfVar2->twiddle[0].im + lVar3) =
           *(ulong *)((long)&pfVar2->twiddle[0].im + lVar3) ^ 0x8000000000000000;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)M << 4 != lVar3);
  }
  return pfVar2;
}

Assistant:

fft_object fft_init(int N, int sgn) {
	fft_object obj = NULL;
	// Change N/2 to N-1 for longvector case

	int twi_len,ct,out;
	out = dividebyN(N);

	if (out == 1) {
		obj = (fft_object) malloc (sizeof(struct fft_set) + sizeof(fft_data)* (N-1));
		obj->lf = factors(N,obj->factors);
		longvectorN(obj->twiddle,N,obj->factors,obj->lf);
		twi_len = N;
		obj->lt = 0;
	} else {
		int K,M;
		K = (int) pow(2.0,ceil(log10(N)/log10(2.0)));

		if (K < 2 * N - 2) {
			M = K * 2;
		} else {
			M = K;
		}
		obj = (fft_object) malloc (sizeof(struct fft_set) + sizeof(fft_data)* (M-1));
		obj->lf = factors(M,obj->factors);
		longvectorN(obj->twiddle,M,obj->factors,obj->lf);
		obj->lt = 1;
		twi_len = M;
	}


	obj->N = N;
	obj->sgn = sgn;

	if (sgn == -1) {
		for(ct = 0; ct < twi_len;ct++) {
			(obj->twiddle+ct)->im = - (obj->twiddle+ct)->im;

		}
	}

	return obj;
}